

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall
cimg_library::CImg<char>::append(CImg<char> *this,CImg<char> *img,char axis,float align)

{
  bool bVar1;
  CImg<char> *pCVar2;
  CImgList<char> local_50;
  CImg<char> local_40;
  
  bVar1 = is_empty(this);
  if (bVar1) {
    pCVar2 = assign<char>(this,img,false);
    return pCVar2;
  }
  if (img->_data != (char *)0x0) {
    CImgList<char>::CImgList<char,char>(&local_50,this,img,true);
    CImgList<char>::get_append(&local_40,&local_50,axis,align);
    this = move_to(&local_40,this);
    ~CImg(&local_40);
    CImgList<char>::~CImgList(&local_50);
  }
  return this;
}

Assistant:

CImg<T>& append(const CImg<T>& img, const char axis='x', const float align=0) {
      if (is_empty()) return assign(img,false);
      if (!img) return *this;
      return CImgList<T>(*this,img,true).get_append(axis,align).move_to(*this);
    }